

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqstate.cpp
# Opt level: O2

RefNode * __thiscall
RefTable::Get(RefTable *this,SQObject *obj,SQHash *mainpos,RefNode **prev,bool add)

{
  SQUnsignedInteger *pSVar1;
  SQObjectType SVar2;
  SQHash SVar3;
  RefNode **ppRVar4;
  RefNode *pRVar5;
  SQObjectPtr local_40;
  
  local_40.super_SQObject._type = obj->_type;
  local_40.super_SQObject._unVal = (SQObjectValue)(obj->_unVal).pTable;
  if ((local_40.super_SQObject._type >> 0x1b & 1) != 0) {
    pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).super_SQCollectable.
              super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SVar3 = HashObj(&local_40);
  *mainpos = this->_numofslots - 1 & SVar3;
  SQObjectPtr::~SQObjectPtr(&local_40);
  *prev = (RefNode *)0x0;
  SVar3 = *mainpos;
  ppRVar4 = this->_buckets + SVar3;
  SVar2 = obj->_type;
  while( true ) {
    pRVar5 = *ppRVar4;
    if (pRVar5 == (RefNode *)0x0) {
      if (add) {
        if (this->_numofslots == this->_slotused) {
          if (this->_freelist != (RefNode *)0x0) {
            __assert_fail("_freelist == 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_1510/DaZombieKiller[P]SqNET/squirrel/squirrel/sqstate.cpp"
                          ,0x206,
                          "RefTable::RefNode *RefTable::Get(SQObject &, SQHash &, RefNode **, bool)"
                         );
          }
          Resize(this,this->_numofslots * 2);
          local_40.super_SQObject._type = obj->_type;
          local_40.super_SQObject._unVal = (SQObjectValue)(obj->_unVal).pTable;
          if ((local_40.super_SQObject._type >> 0x1b & 1) != 0) {
            pSVar1 = &((local_40.super_SQObject._unVal.pTable)->super_SQDelegable).
                      super_SQCollectable.super_SQRefCounted._uiRef;
            *pSVar1 = *pSVar1 + 1;
          }
          SVar3 = HashObj(&local_40);
          *mainpos = this->_numofslots - 1 & SVar3;
          SQObjectPtr::~SQObjectPtr(&local_40);
          SVar3 = *mainpos;
        }
        pRVar5 = Add(this,SVar3,obj);
      }
      else {
        pRVar5 = (RefNode *)0x0;
      }
      return pRVar5;
    }
    if (((pRVar5->obj).super_SQObject._unVal.pTable == (obj->_unVal).pTable) &&
       ((pRVar5->obj).super_SQObject._type == SVar2)) break;
    *prev = pRVar5;
    ppRVar4 = &pRVar5->next;
  }
  return pRVar5;
}

Assistant:

RefTable::RefNode *RefTable::Get(SQObject &obj,SQHash &mainpos,RefNode **prev,bool add)
{
    RefNode *ref;
    mainpos = ::HashObj(obj)&(_numofslots-1);
    *prev = NULL;
    for (ref = _buckets[mainpos]; ref; ) {
        if(_rawval(ref->obj) == _rawval(obj) && type(ref->obj) == type(obj))
            break;
        *prev = ref;
        ref = ref->next;
    }
    if(ref == NULL && add) {
        if(_numofslots == _slotused) {
            assert(_freelist == 0);
            Resize(_numofslots*2);
            mainpos = ::HashObj(obj)&(_numofslots-1);
        }
        ref = Add(mainpos,obj);
    }
    return ref;
}